

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint64_t helper_neon_abdl_s16_aarch64(uint32_t a,uint32_t b)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar3 = (int)(char)a - (int)(char)b;
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  iVar4 = (int)(char)(a >> 8) - (int)(char)(b >> 8);
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  uVar5 = (int)(char)(a >> 0x10) - (int)(char)(b >> 0x10);
  uVar3 = -uVar5;
  if (0 < (int)uVar5) {
    uVar3 = uVar5;
  }
  uVar6 = ((int)a >> 0x18) - ((int)b >> 0x18);
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  return (ulong)uVar5 << 0x30 | (ulong)uVar1 | (ulong)(uint)(iVar2 << 0x10) | (ulong)uVar3 << 0x20;
}

Assistant:

uint64_t HELPER(neon_abdl_s16)(uint32_t a, uint32_t b)
{
    uint64_t tmp;
    uint64_t result;
    DO_ABD(result, a, b, int8_t, int32_t);
    DO_ABD(tmp, a >> 8, b >> 8, int8_t, int32_t);
    result |= tmp << 16;
    DO_ABD(tmp, a >> 16, b >> 16, int8_t, int32_t);
    result |= tmp << 32;
    DO_ABD(tmp, a >> 24, b >> 24, int8_t, int32_t);
    result |= tmp << 48;
    return result;
}